

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O0

void resume(lua_State *L,void *ud)

{
  CallInfo *ci_00;
  int iVar1;
  CallInfo *ci;
  StkId firstArg;
  int n;
  void *ud_local;
  lua_State *L_local;
  
  firstArg._4_4_ = *ud;
  ci = (CallInfo *)(L->top + -(long)firstArg._4_4_);
  ci_00 = L->ci;
  if (L->status == '\0') {
    iVar1 = luaD_precall(L,(StkId)&ci[-1].extra,-1);
    if (iVar1 == 0) {
      luaV_execute(L);
    }
  }
  else {
    L->status = '\0';
    ci_00->func = (StkId)((long)&L->stack->value_ + ci_00->extra);
    if ((ci_00->callstatus & 2) == 0) {
      if ((ci_00->u).l.base != (StkId)0x0) {
        firstArg._4_4_ = (*(ci_00->u).c.k)(L,1,(ci_00->u).c.ctx);
        ci = (CallInfo *)(L->top + -(long)firstArg._4_4_);
      }
      luaD_poscall(L,ci_00,(StkId)ci,firstArg._4_4_);
    }
    else {
      luaV_execute(L);
    }
    unroll(L,(void *)0x0);
  }
  return;
}

Assistant:

static void resume(lua_State *L, void *ud) {
    int n = *(cast(int*, ud));  /* number of arguments */
    StkId firstArg = L->top - n;  /* first argument */
    CallInfo *ci = L->ci;
    if (L->status == LUA_OK) {  /* starting a coroutine? */
        if (!luaD_precall(L, firstArg - 1, LUA_MULTRET))  /* Lua function? */
            luaV_execute(L);  /* call it */
    } else {  /* resuming from previous yield */
        lua_assert(L->status == LUA_YIELD);
        L->status = LUA_OK;  /* mark that it is running (again) */
        ci->func = restorestack(L, ci->extra);
        if (isLua(ci))  /* yielded inside a hook? */
            luaV_execute(L);  /* just continue running Lua code */
        else {  /* 'common' yield */
            if (ci->u.c.k != NULL) {  /* does it have a continuation function? */
                lua_unlock(L);
                n = (*ci->u.c.k)(L, LUA_YIELD, ci->u.c.ctx); /* call continuation */
                lua_lock(L);
                api_checknelems(L, n);
                firstArg = L->top - n;  /* yield results come from continuation */
            }
            luaD_poscall(L, ci, firstArg, n);  /* finish 'luaD_precall' */
        }
        unroll(L, NULL);  /* run continuation */
    }
}